

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall cppjieba::DictTrie::LoadUserDict(DictTrie *this,string *filePaths)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  undefined8 uVar5;
  ostream *poVar6;
  reference pvVar7;
  istream *piVar8;
  long lVar9;
  string line;
  ifstream ifs;
  size_t i;
  size_t lineno;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostream *in_stack_fffffffffffffba0;
  size_t in_stack_fffffffffffffba8;
  string *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  string local_418 [52];
  int in_stack_fffffffffffffc1c;
  char *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  Logger *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffd18;
  DictTrie *in_stack_fffffffffffffd20;
  istream local_278 [520];
  ulong local_70;
  long local_68;
  allocator local_49;
  string local_48 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"|;",&local_49);
  limonp::Split(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = 0;
  for (local_70 = 0; uVar1 = local_70,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_28), uVar1 < sVar4; local_70 = local_70 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_28,local_70);
    uVar5 = std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_278,uVar5,8);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      limonp::Logger::Logger
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                 in_stack_fffffffffffffc1c);
      poVar6 = limonp::Logger::Stream((Logger *)(local_418 + 0x20));
      poVar6 = std::operator<<(poVar6,"exp: [ifs.is_open()");
      poVar6 = std::operator<<(poVar6,"] false. ");
      poVar6 = std::operator<<(poVar6,"open ");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_28,local_70);
      in_stack_fffffffffffffba0 = std::operator<<(poVar6,(string *)pvVar7);
      std::operator<<(in_stack_fffffffffffffba0," failed");
      limonp::Logger::~Logger((Logger *)CONCAT17(bVar2,in_stack_fffffffffffffbc0));
    }
    std::__cxx11::string::string(local_418);
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_278,local_418);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
      if (!bVar3) break;
      lVar9 = std::__cxx11::string::size();
      if (lVar9 != 0) {
        InserUserDictNode(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      }
      local_68 = local_68 + 1;
    }
    std::__cxx11::string::~string(local_418);
    std::ifstream::~ifstream(local_278);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffba0);
  return;
}

Assistant:

void LoadUserDict(const string& filePaths) {
    vector<string> files = limonp::Split(filePaths, "|;");
    size_t lineno = 0;
    for (size_t i = 0; i < files.size(); i++) {
      ifstream ifs(files[i].c_str());
      XCHECK(ifs.is_open()) << "open " << files[i] << " failed"; 
      string line;
      
      for (; getline(ifs, line); lineno++) {
        if (line.size() == 0) {
          continue;
        }
        InserUserDictNode(line);
      }
    }
  }